

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_helpers.hpp
# Opt level: O0

void duckdb::IntervalAdd::AddConstant<duckdb::IntervalAvgState,duckdb::interval_t>
               (IntervalAvgState *state,interval_t input,idx_t count)

{
  long lVar1;
  int64_t in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  interval_t iVar2;
  long count64;
  undefined8 local_58;
  undefined8 local_50;
  unsigned_long in_stack_ffffffffffffffc0;
  
  lVar1 = Cast::Operation<unsigned_long,long>(in_stack_ffffffffffffffc0);
  iVar2.micros = in_RDX;
  iVar2._0_8_ = in_RSI;
  iVar2 = duckdb::MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                    (iVar2,lVar1);
  iVar2 = duckdb::AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                    (*(interval_t *)(in_RDI + 8),iVar2);
  local_58 = iVar2._0_8_;
  *(undefined8 *)(in_RDI + 8) = local_58;
  local_50 = iVar2.micros;
  *(int64_t *)(in_RDI + 0x10) = local_50;
  return;
}

Assistant:

static void AddConstant(STATE &state, T input, idx_t count) {
		const auto count64 = Cast::Operation<idx_t, int64_t>(count);
		input = MultiplyOperator::Operation<interval_t, int64_t, interval_t>(input, count64);
		state.value = AddOperator::Operation<interval_t, interval_t, interval_t>(state.value, input);
	}